

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_server.h
# Opt level: O0

void __thiscall
rest_rpc::rpc_service::rpc_server::publish<char_const*>(rpc_server *this,string *key,char *data)

{
  string *in_RSI;
  char *in_stack_00000108;
  string *in_stack_00000110;
  string *in_stack_00000118;
  rpc_server *in_stack_00000120;
  allocator local_59;
  string local_58 [32];
  string local_38 [56];
  
  std::__cxx11::string::string(local_38,in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"",&local_59);
  publish<char_const*>(in_stack_00000120,in_stack_00000118,in_stack_00000110,in_stack_00000108);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void publish(const std::string &key, T data) {
    publish(key, "", std::move(data));
  }